

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O0

VkImageCreateInfo *
vkt::FragmentOperations::anon_unknown_0::makeImageCreateInfo
          (VkImageCreateInfo *__return_storage_ptr__,VkFormat format,IVec2 *size,
          VkImageUsageFlags usage)

{
  deUint32 width;
  deUint32 height;
  VkExtent3D VVar1;
  VkImageCreateInfo *imageParams;
  undefined8 local_30;
  deUint32 local_28;
  VkImageUsageFlags usage_local;
  IVec2 *size_local;
  VkFormat format_local;
  
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->imageType = VK_IMAGE_TYPE_2D;
  __return_storage_ptr__->format = format;
  width = tcu::Vector<int,_2>::x(size);
  height = tcu::Vector<int,_2>::y(size);
  VVar1 = ::vk::makeExtent3D(width,height,1);
  local_30 = VVar1._0_8_;
  (__return_storage_ptr__->extent).width = (undefined4)local_30;
  (__return_storage_ptr__->extent).height = local_30._4_4_;
  local_28 = VVar1.depth;
  (__return_storage_ptr__->extent).depth = local_28;
  __return_storage_ptr__->mipLevels = 1;
  __return_storage_ptr__->arrayLayers = 1;
  __return_storage_ptr__->samples = VK_SAMPLE_COUNT_1_BIT;
  __return_storage_ptr__->tiling = VK_IMAGE_TILING_OPTIMAL;
  __return_storage_ptr__->usage = usage;
  __return_storage_ptr__->sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  __return_storage_ptr__->queueFamilyIndexCount = 0;
  __return_storage_ptr__->pQueueFamilyIndices = (deUint32 *)0x0;
  __return_storage_ptr__->initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  return __return_storage_ptr__;
}

Assistant:

VkImageCreateInfo makeImageCreateInfo (const VkFormat format, const IVec2& size, VkImageUsageFlags usage)
{
	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		(VkImageCreateFlags)0,							// VkImageCreateFlags		flags;
		VK_IMAGE_TYPE_2D,								// VkImageType				imageType;
		format,											// VkFormat					format;
		makeExtent3D(size.x(), size.y(), 1),			// VkExtent3D				extent;
		1u,												// deUint32					mipLevels;
		1u,												// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,							// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,						// VkImageTiling			tiling;
		usage,											// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,						// VkSharingMode			sharingMode;
		0u,												// deUint32					queueFamilyIndexCount;
		DE_NULL,										// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			initialLayout;
	};
	return imageParams;
}